

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

FileType DirUtils::GetFileType(string *p)

{
  int iVar1;
  char *__file;
  undefined1 local_a8 [4];
  int res;
  stat st;
  string *p_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)p;
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)local_a8);
  if (iVar1 == 0) {
    if (((uint)st.st_nlink & 0xf000) == 0x4000) {
      p_local._4_4_ = DU_DIRECTORY;
    }
    else if (((uint)st.st_nlink & 0xf000) == 0x8000) {
      p_local._4_4_ = DU_FILE;
    }
    else {
      p_local._4_4_ = DU_OTHER;
    }
  }
  else {
    p_local._4_4_ = DU_NULL;
  }
  return p_local._4_4_;
}

Assistant:

DirUtils::FileType DirUtils::GetFileType(const string& p){
	struct stat st;
	int res = stat(p.c_str(), &st);
	if(res != 0){
		return DU_NULL;
	}
	if(S_ISDIR(st.st_mode) != 0)
		return DU_DIRECTORY;
	if(S_ISREG(st.st_mode) != 0)
		return DU_FILE;
	return DU_OTHER;
}